

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

longlong GetExecutorResultLong(uint tempStackType,uint *tempStackArrayBase)

{
  if (tempStackType == 5) {
    return *(longlong *)tempStackArrayBase;
  }
  __assert_fail("!\"return type is not \'long\'\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                ,0x6f7,"long long GetExecutorResultLong(unsigned int, unsigned int *)");
}

Assistant:

long long GetExecutorResultLong(unsigned tempStackType, unsigned *tempStackArrayBase)
{
	long long value = 0;

	switch(tempStackType)
	{
	case NULLC_TYPE_LONG:
		memcpy(&value, tempStackArrayBase, sizeof(value));
		return value;
	default:
		assert(!"return type is not 'long'");
		break;
	}

	return value;
}